

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

int Abc_NtkDontCareTransfer(Odc_Man_t *p)

{
  ulong uVar1;
  undefined4 uVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long lVar5;
  ushort iFan1;
  Odc_Lit_t OVar6;
  Odc_Lit_t OVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  void *pvVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  
  pAVar3 = p->pNode->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar11 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar11 + 500;
    iVar15 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar15) {
      piVar8 = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar15;
    }
    if (-500 < iVar11) {
      memset((pAVar3->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar15;
  }
  iVar11 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar11 + 1;
  if (0x3ffffffe < iVar11) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar9 = p->vLeaves;
  if (0 < pVVar9->nSize) {
    uVar13 = 2;
    lVar14 = 0;
    do {
      if (p->nPis <= lVar14) goto LAB_00284dd6;
      plVar4 = (long *)pVVar9->pArray[lVar14];
      uVar12 = (uVar13 & 0xfffe) << 0x10 | uVar13 & 0xfffe;
      plVar4[8] = (long)(int)uVar12;
      lVar5 = *plVar4;
      uVar2 = *(undefined4 *)(lVar5 + 0xd8);
      iVar11 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar11 + 1,uVar12);
      if (((long)iVar11 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar11)) goto LAB_00284db7;
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar11 * 4) = uVar2;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vLeaves;
      uVar13 = uVar13 + 2;
    } while (lVar14 < pVVar9->nSize);
  }
  pVVar9 = p->vBranches;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar11 = p->nVarsMax + (int)lVar14;
      if ((iVar11 < 0) || (p->nPis <= iVar11)) {
LAB_00284dd6:
        __assert_fail("i >= 0 && i < p->nPis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                      ,0x72,"Odc_Lit_t Odc_Var(Odc_Man_t *, int)");
      }
      plVar4 = (long *)pVVar9->pArray[lVar14];
      uVar13 = iVar11 * 2 + 2;
      uVar12 = uVar13 & 0xffff;
      plVar4[8] = (long)(int)(uVar13 * 0x10000 | uVar12);
      lVar5 = *plVar4;
      uVar2 = *(undefined4 *)(lVar5 + 0xd8);
      iVar11 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar11 + 1,uVar12);
      if (((long)iVar11 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar11)) {
LAB_00284db7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar11 * 4) = uVar2;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vBranches;
    } while (lVar14 < pVVar9->nSize);
  }
  p->iRoot = 1;
  pVVar9 = p->vRoots;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      pvVar10 = Abc_NtkDontCareTransfer_rec(p,(Abc_Obj_t *)pVVar9->pArray[lVar14],p->pNode);
      iFan1 = (ushort)((ulong)pvVar10 >> 0x10);
      OVar6 = Odc_And(p,(Odc_Lit_t)pvVar10,iFan1 ^ 1);
      OVar7 = Odc_And(p,(Odc_Lit_t)pvVar10 ^ 1,iFan1);
      OVar6 = Odc_And(p,OVar6 ^ 1,OVar7 ^ 1);
      OVar6 = Odc_And(p,p->iRoot ^ 1,OVar6);
      p->iRoot = OVar6 ^ 1;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vRoots;
    } while (lVar14 < pVVar9->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkDontCareTransfer( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    Odc_Lit_t uRes0, uRes1;
    Odc_Lit_t uLit;
    unsigned uData;
    int i;
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    // set elementary variables at the leaves 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
    {
        uLit = Odc_Var( p, i );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // set elementary variables at the branched 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
    {
        uLit = Odc_Var( p, i+p->nVarsMax );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // compute the AIG for the window
    p->iRoot = Odc_Const0();
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        uData = (unsigned)(ABC_PTRUINT_T)Abc_NtkDontCareTransfer_rec( p, pObj, p->pNode );
        // get the cofactors
        uRes0 = uData & 0xffff;
        uRes1 = uData >> 16;
        // compute the miter
//        assert( uRes0 != uRes1 ); // may be false if the node is redundant w.r.t. this root
        uLit = Odc_Xor( p, uRes0, uRes1 );
        p->iRoot = Odc_Or( p, p->iRoot, uLit );
    }
    return 1;
}